

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string *printable_name)

{
  long lVar1;
  once_flag *poVar2;
  bool bVar3;
  ulong uVar4;
  anon_union_8_8_13f84498_for_Symbol_2 aVar5;
  long lVar6;
  anon_union_8_8_13f84498_for_Symbol_2 aVar7;
  ulong uVar8;
  long lVar9;
  anon_union_8_8_13f84498_for_Symbol_2 aVar10;
  bool bVar11;
  Symbol SVar12;
  anon_union_8_8_13f84498_for_Symbol_2 local_58;
  long local_50;
  ulong local_48;
  anon_union_8_8_13f84498_for_Symbol_2 local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  
  if (*(int *)(extendee + 0x78) != 0) {
    SVar12 = Tables::FindByNameHelper
                       ((this->tables_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                        _M_head_impl,this,printable_name);
    aVar7 = SVar12.field_1;
    if ((SVar12.type != FIELD) ||
       (*(FieldDescriptor *)(aVar7.descriptor + 0x42) == (FieldDescriptor)0x0)) {
      aVar7.descriptor = (Descriptor *)0x0;
    }
    if ((aVar7.descriptor != (Descriptor *)0x0) &&
       (*(Descriptor **)(aVar7.descriptor + 0x50) == extendee)) {
      return (FieldDescriptor *)aVar7;
    }
    if (*(char *)(*(long *)(extendee + 0x20) + 0x48) == '\x01') {
      SVar12 = Tables::FindByNameHelper
                         ((this->tables_)._M_t.
                          super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                          _M_head_impl,this,printable_name);
      aVar5 = SVar12.field_1;
      if (aVar5.descriptor == (Descriptor *)0x0 || SVar12.type != MESSAGE) {
        bVar11 = true;
      }
      else {
        uVar4 = (ulong)*(int *)(aVar5.descriptor + 0x7c);
        bVar11 = (long)uVar4 < 1;
        if (0 < (long)uVar4) {
          lVar6 = -uVar4;
          lVar9 = 0x68;
          uVar8 = 1;
          aVar10 = aVar7;
          local_50 = lVar6;
          local_48 = uVar4;
          local_40 = aVar5;
          do {
            lVar1 = *(long *)(aVar5.descriptor + 0x50);
            if (*(Descriptor **)(lVar1 + -0x18 + lVar9) == extendee) {
              aVar7.descriptor = (Descriptor *)(lVar1 + lVar9 + -0x68);
              poVar2 = *(once_flag **)(lVar1 + lVar9 + -0x38);
              if (poVar2 != (once_flag *)0x0) {
                local_58.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
                local_38.descriptor = aVar7.descriptor;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (poVar2,(_func_void_FieldDescriptor_ptr **)&local_58.descriptor,
                           &local_38.field_descriptor);
                uVar4 = local_48;
                aVar5 = local_40;
                lVar6 = local_50;
              }
              if ((*(int *)(lVar1 + -0x30 + lVar9) != 0xb) || (*(int *)(lVar1 + -0x2c + lVar9) != 1)
                 ) goto LAB_00317f77;
              poVar2 = *(once_flag **)(lVar1 + -0x38 + lVar9);
              if (poVar2 != (once_flag *)0x0) {
                local_58.descriptor = aVar7.descriptor;
                std::
                call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (poVar2,FieldDescriptor::TypeOnceInit,&local_58.field_descriptor);
                uVar4 = local_48;
                aVar5 = local_40;
                lVar6 = local_50;
              }
              if (*(Descriptor **)(lVar1 + lVar9) != aVar5.descriptor) goto LAB_00317f77;
              bVar3 = false;
            }
            else {
LAB_00317f77:
              bVar3 = true;
              aVar7 = aVar10;
            }
            if (!bVar3) break;
            bVar11 = uVar4 <= uVar8;
            lVar9 = lVar9 + 0x98;
            lVar1 = lVar6 + uVar8;
            uVar8 = uVar8 + 1;
            aVar10 = aVar7;
          } while (lVar1 != 0);
        }
      }
      if (!bVar11) {
        return (FieldDescriptor *)aVar7;
      }
    }
  }
  return (FieldDescriptor *)(Descriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, const std::string& printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}